

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_assertion.hpp
# Opt level: O3

bool iutest::internal::
     iuOperatorEQ<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>>
               (basic_string_view<char,_std::char_traits<char>_> *v1,
               basic_string_view<char,_std::char_traits<char>_> *v2)

{
  size_t __n;
  int iVar1;
  
  __n = v1->_M_len;
  if (__n != v2->_M_len) {
    return false;
  }
  if ((__n != 0) && (iVar1 = bcmp(v1->_M_str,v2->_M_str,__n), iVar1 != 0)) {
    return false;
  }
  return true;
}

Assistant:

bool iuOperatorEQ(const T1& v1, const T2& v2)
{
IUTEST_PRAGMA_WARN_PUSH()
IUTEST_PRAGMA_WARN_DISABLE_SIGN_COMPARE()
IUTEST_PRAGMA_WARN_DISABLE_IMPLICIT_INT_FLOAT_CONVERSION()
    return v1 == v2;
IUTEST_PRAGMA_WARN_POP()
}